

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O3

VarType * deqp::gles2::Functional::generateRandomType
                    (VarType *__return_storage_ptr__,int maxDepth,int *curStructIdx,
                    vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                    *structTypesDst,Random *rnd)

{
  DataType basicType;
  iterator __position;
  bool bVar1;
  VarType *this;
  deUint32 dVar2;
  StructType *this_00;
  long *plVar3;
  VarType *extraout_RAX;
  VarType *extraout_RAX_00;
  VarType *extraout_RAX_01;
  long *plVar4;
  Precision precision;
  int iVar5;
  float fVar6;
  float fVar7;
  StructType *structType;
  long *local_210;
  long local_200;
  long lStack_1f8;
  StructType *local_1f0;
  float local_1e4;
  long *local_1e0 [2];
  long local_1d0 [2];
  VarType *local_1c0;
  vector<glu::StructType_const*,std::allocator<glu::StructType_const*>> *local_1b8;
  int *local_1b0;
  VarType local_1a8 [4];
  ios_base local_138 [264];
  
  local_1b0 = curStructIdx;
  fVar6 = deRandom_getFloat(&rnd->m_rnd);
  if ((maxDepth < 1) ||
     (fVar7 = deRandom_getFloat(&rnd->m_rnd), bVar1 = 0.2 <= fVar6, fVar6 = fVar7, bVar1)) {
    dVar2 = deRandom_getUint32(&rnd->m_rnd);
    basicType = (&s_testDataTypes)
                [dVar2 - (((uint)((ulong)dVar2 * 0xf0f0f0f1 >> 0x20) & 0xfffffff0) + dVar2 / 0x11)];
    precision = (uint)(basicType - TYPE_BOOL < 4) * 2 + PRECISION_MEDIUMP;
    if (0.3 <= fVar6) {
      glu::VarType::VarType(__return_storage_ptr__,basicType,precision);
      return extraout_RAX;
    }
    glu::VarType::VarType(local_1a8,basicType,precision);
    dVar2 = deRandom_getUint32(&rnd->m_rnd);
    glu::VarType::VarType(__return_storage_ptr__,local_1a8,dVar2 % 5 + 1);
  }
  else {
    local_1e4 = fVar7;
    dVar2 = deRandom_getUint32(&rnd->m_rnd);
    this_00 = (StructType *)operator_new(0x38);
    iVar5 = *local_1b0;
    *local_1b0 = iVar5 + 1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,iVar5);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_1e0,0,(char *)0x0,0x1bd1902);
    local_210 = &local_200;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_200 = *plVar4;
      lStack_1f8 = plVar3[3];
    }
    else {
      local_200 = *plVar4;
      local_210 = (long *)*plVar3;
    }
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,(char *)local_210,(allocator<char> *)local_1a8);
    (this_00->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_210 != &local_200) {
      operator_delete(local_210,local_200 + 1);
    }
    local_1c0 = __return_storage_ptr__;
    local_1b8 = (vector<glu::StructType_const*,std::allocator<glu::StructType_const*>> *)
                structTypesDst;
    if (local_1e0[0] != local_1d0) {
      operator_delete(local_1e0[0],local_1d0[0] + 1);
    }
    iVar5 = 0;
    local_1f0 = this_00;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,iVar5);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_1e0,0,(char *)0x0,0x1ab2bc9);
      local_210 = &local_200;
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_200 = *plVar4;
        lStack_1f8 = plVar3[3];
      }
      else {
        local_200 = *plVar4;
        local_210 = (long *)*plVar3;
      }
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      generateRandomType(local_1a8,maxDepth + -1,local_1b0,
                         (vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                          *)local_1b8,rnd);
      glu::StructType::addMember(this_00,(char *)local_210,local_1a8);
      glu::VarType::~VarType(local_1a8);
      if (local_210 != &local_200) {
        operator_delete(local_210,local_200 + 1);
      }
      if (local_1e0[0] != local_1d0) {
        operator_delete(local_1e0[0],local_1d0[0] + 1);
      }
      iVar5 = iVar5 + 1;
    } while (dVar2 % 5 + 1 != iVar5);
    __position._M_current = *(StructType ***)(local_1b8 + 8);
    if (__position._M_current == *(StructType ***)(local_1b8 + 0x10)) {
      std::vector<glu::StructType_const*,std::allocator<glu::StructType_const*>>::
      _M_realloc_insert<glu::StructType_const*const&>(local_1b8,__position,&local_1f0);
    }
    else {
      *__position._M_current = this_00;
      *(long *)(local_1b8 + 8) = *(long *)(local_1b8 + 8) + 8;
    }
    this = local_1c0;
    if (0.3 <= local_1e4) {
      glu::VarType::VarType(local_1c0,local_1f0);
      return extraout_RAX_01;
    }
    glu::VarType::VarType(local_1a8,local_1f0);
    dVar2 = deRandom_getUint32(&rnd->m_rnd);
    glu::VarType::VarType(this,local_1a8,dVar2 % 5 + 1);
  }
  glu::VarType::~VarType(local_1a8);
  return extraout_RAX_00;
}

Assistant:

static glu::VarType generateRandomType (const int maxDepth, int& curStructIdx, vector<const StructType*>& structTypesDst, Random& rnd)
{
	const bool isStruct		= maxDepth > 0 && rnd.getFloat() < 0.2f;
	const bool isArray		= rnd.getFloat() < 0.3f;

	if (isStruct)
	{
		const int			numMembers = rnd.getInt(1, 5);
		StructType* const	structType = new StructType(("structType" + de::toString(curStructIdx++)).c_str());

		for (int i = 0; i < numMembers; i++)
			structType->addMember(("m" + de::toString(i)).c_str(), generateRandomType(maxDepth-1, curStructIdx, structTypesDst, rnd));

		structTypesDst.push_back(structType);
		return isArray ? glu::VarType(glu::VarType(structType), rnd.getInt(1, 5)) : glu::VarType(structType);
	}
	else
	{
		const glu::DataType		basicType = (glu::DataType)s_testDataTypes[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_testDataTypes)-1)];
		const glu::Precision	precision = glu::isDataTypeBoolOrBVec(basicType) ? glu::PRECISION_LAST : glu::PRECISION_MEDIUMP;
		return isArray ? glu::VarType(glu::VarType(basicType, precision), rnd.getInt(1, 5)) : glu::VarType(basicType, precision);
	}
}